

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O1

void __thiscall cmLocalGenerator::ComputeObjectMaxPath(cmLocalGenerator *this)

{
  cmMakefile *this_00;
  int iVar1;
  char *__s;
  size_t sVar2;
  ostream *poVar3;
  uint pmax;
  ostringstream w;
  uint local_1b4;
  string local_1b0;
  undefined1 local_190 [112];
  ios_base local_120 [264];
  
  this->ObjectPathMax = 1000;
  this_00 = this->Makefile;
  local_190._0_8_ = local_190 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_190,"CMAKE_OBJECT_PATH_MAX","");
  __s = cmMakefile::GetDefinition(this_00,(string *)local_190);
  if ((undefined1 *)local_190._0_8_ != local_190 + 0x10) {
    operator_delete((void *)local_190._0_8_,local_190._16_8_ + 1);
  }
  if ((__s != (char *)0x0) && (*__s != '\0')) {
    iVar1 = __isoc99_sscanf(__s,"%u",&local_1b4);
    if (iVar1 == 1) {
      if (0x7f < (ulong)local_1b4) {
        this->ObjectPathMax = (ulong)local_1b4;
        goto LAB_0034b16f;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_190,"CMAKE_OBJECT_PATH_MAX is set to ",0x20);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)local_190);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,", which is less than the minimum of 128.  ",0x2a);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"The value will be ignored.",0x1a);
      std::__cxx11::stringbuf::str();
      cmake::IssueMessage(this->GlobalGenerator->CMakeInstance,AUTHOR_WARNING,&local_1b0,
                          &this->DirectoryBacktrace);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_190,"CMAKE_OBJECT_PATH_MAX is set to \"",0x21);
      sVar2 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,__s,sVar2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_190,"\", which fails to parse as a positive integer.  ",0x30);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_190,"The value will be ignored.",0x1a);
      std::__cxx11::stringbuf::str();
      cmake::IssueMessage(this->GlobalGenerator->CMakeInstance,AUTHOR_WARNING,&local_1b0,
                          &this->DirectoryBacktrace);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
      operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
    std::ios_base::~ios_base(local_120);
  }
LAB_0034b16f:
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&(this->ObjectMaxPathViolations)._M_t);
  return;
}

Assistant:

void cmLocalGenerator::ComputeObjectMaxPath()
{
// Choose a maximum object file name length.
#if defined(_WIN32) || defined(__CYGWIN__)
  this->ObjectPathMax = 250;
#else
  this->ObjectPathMax = 1000;
#endif
  const char* plen = this->Makefile->GetDefinition("CMAKE_OBJECT_PATH_MAX");
  if (plen && *plen) {
    unsigned int pmax;
    if (sscanf(plen, "%u", &pmax) == 1) {
      if (pmax >= 128) {
        this->ObjectPathMax = pmax;
      } else {
        std::ostringstream w;
        w << "CMAKE_OBJECT_PATH_MAX is set to " << pmax
          << ", which is less than the minimum of 128.  "
          << "The value will be ignored.";
        this->IssueMessage(cmake::AUTHOR_WARNING, w.str());
      }
    } else {
      std::ostringstream w;
      w << "CMAKE_OBJECT_PATH_MAX is set to \"" << plen
        << "\", which fails to parse as a positive integer.  "
        << "The value will be ignored.";
      this->IssueMessage(cmake::AUTHOR_WARNING, w.str());
    }
  }
  this->ObjectMaxPathViolations.clear();
}